

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

int RegexTree::number_node
              (unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
               *m,tree_node *ptr,int i)

{
  tree_node *this;
  pair<const_tree_node_*const,_int> local_38;
  int local_24;
  tree_node *ptStack_20;
  int i_local;
  tree_node *ptr_local;
  unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
  *m_local;
  
  local_24 = i;
  ptStack_20 = ptr;
  ptr_local = (tree_node *)m;
  if (ptr->left != (tree_node *)0x0) {
    local_24 = number_node(m,ptr->left,i);
  }
  if (ptStack_20->right != (tree_node *)0x0) {
    local_24 = number_node((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
                            *)ptr_local,ptStack_20->right,local_24);
  }
  this = ptr_local;
  if ((ptStack_20->right == (tree_node *)0x0) && (ptStack_20->left == (tree_node *)0x0)) {
    std::pair<const_tree_node_*const,_int>::pair<tree_node_*&,_int_&,_true>
              (&local_38,&stack0xffffffffffffffe0,&local_24);
    std::
    unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
    ::insert((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
              *)this,&local_38);
    m_local._4_4_ = local_24 + 1;
  }
  else {
    m_local._4_4_ = local_24;
  }
  return m_local._4_4_;
}

Assistant:

int RegexTree::number_node(std::unordered_map<const tree_node *, int> &m, tree_node *ptr, int i) {
    if (ptr->left != nullptr) {
        i = number_node(m, ptr->left, i);
    }
    if (ptr->right != nullptr) {
        i = number_node(m, ptr->right, i);
    }
    if (ptr->right == nullptr && ptr->left == nullptr) {
        m.insert({ptr, i});
        return i + 1;
    }
    return i;
}